

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_glyph_outline.cpp
# Opt level: O3

bool __thiscall ON_OutlineFigure::IsValidFigure(ON_OutlineFigure *this,bool bLogErrors)

{
  ON_OutlineFigurePoint *pOVar1;
  ON_OutlineFigurePoint *pOVar2;
  ON__UINT16 OVar3;
  bool bVar4;
  ON__UINT32 OVar5;
  char *sFormat;
  int line_number;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  ON_OutlineFigurePoint figure_start;
  ON_OutlineFigurePoint figure_end;
  ON_OutlineFigurePoint local_70;
  ulong local_60;
  ON_OutlineFigurePoint local_58;
  ON_OutlineFigurePoint local_48;
  ON_OutlineFigurePoint *local_38;
  
  OVar5 = Internal_FigureEndDex(this,bLogErrors);
  if (OVar5 != 0) {
    pOVar2 = (this->m_points).m_a;
    local_58.m_point.y = (pOVar2->m_point).y;
    local_58.m_point_type = pOVar2->m_point_type;
    local_58.m_point_proximity = pOVar2->m_point_proximity;
    local_58.m_figure_index = pOVar2->m_figure_index;
    local_58.m_point.x = (pOVar2->m_point).x;
    bVar4 = ON_OutlineFigurePoint::IsBeginFigurePoint(&local_58);
    if (bVar4) {
      if (local_58.m_point_type == BeginFigureUnknown) {
        if (!bLogErrors) {
          return false;
        }
        sFormat = 
        "m_outline_points[figure_start_dex] is ON_OutlineFigurePoint::Type::BeginFigureUnknown.";
        line_number = 0xaa5;
      }
      else {
        OVar3 = local_58.m_figure_index;
        if (local_58.m_figure_index == 0) {
          if (!bLogErrors) {
            return false;
          }
          sFormat = "BeginFigure point has 0 = m_contour_index.";
          line_number = 0xaac;
        }
        else {
          pOVar1 = pOVar2 + OVar5;
          local_48.m_point_type = pOVar1->m_point_type;
          local_48.m_point_proximity = pOVar1->m_point_proximity;
          local_48.m_figure_index = pOVar1->m_figure_index;
          local_48.m_point.x = (pOVar1->m_point).x;
          local_48.m_point.y = pOVar2[OVar5].m_point.y;
          if (local_58.m_figure_index == local_48.m_figure_index) {
            bVar4 = ON_OutlineFigurePoint::IsOnFigure(&local_58);
            if (bVar4) {
              bVar4 = ON_OutlineFigurePoint::IsOnFigure(&local_48);
              if (bVar4) {
                if (local_58.m_point_type == BeginFigureOpen) {
                  if (local_48.m_point_type == EndFigureOpen) {
LAB_004918c8:
                    if (OVar5 == 1) {
                      return true;
                    }
                    uVar7 = 1;
                    do {
                      pOVar1 = pOVar2 + uVar7;
                      local_70.m_point_type = pOVar1->m_point_type;
                      local_70.m_point_proximity = pOVar1->m_point_proximity;
                      local_70.m_figure_index = pOVar1->m_figure_index;
                      local_70.m_point.x = (pOVar1->m_point).x;
                      local_70.m_point.y = pOVar2[uVar7].m_point.y;
                      if (OVar3 != local_70.m_figure_index) {
                        if (!bLogErrors) {
                          return false;
                        }
                        sFormat = 
                        "BeginFigure and interior point have different m_contour_index values.";
                        line_number = 0xae4;
                        goto LAB_0049175b;
                      }
                      if (local_70.m_point_type == CubicBezierPoint) {
                        bVar4 = ON_OutlineFigurePoint::IsOffFigure(&local_70);
                        if (!bVar4) {
                          if (!bLogErrors) {
                            return false;
                          }
                          sFormat = "Interior CubicBezierPoint point IsOffFigure() is false.";
                          line_number = 0xb19;
                          goto LAB_0049175b;
                        }
                        local_38 = pOVar2 + ((int)uVar7 + 1);
                        lVar8 = 0;
                        local_60 = uVar7;
                        do {
                          uVar6 = (int)local_60 + 1;
                          local_60 = (ulong)uVar6;
                          if (OVar5 <= uVar6) {
                            if (!bLogErrors) {
                              return false;
                            }
                            sFormat = "Invalid CubicBezierPoint segment.";
                            line_number = 0xb21;
                            goto LAB_0049175b;
                          }
                          local_70._0_8_ = *(undefined8 *)(&local_38->m_point_type + lVar8);
                          local_70.m_point.y = *(float *)((long)&(local_38->m_point).y + lVar8);
                          if (OVar3 != local_70.m_figure_index) {
                            if (!bLogErrors) {
                              return false;
                            }
                            sFormat = 
                            "BeginFigure and interior point have different m_contour_index values.";
                            line_number = 0xb28;
                            goto LAB_0049175b;
                          }
                          if (local_70.m_point_type != CubicBezierPoint) {
                            if (!bLogErrors) {
                              return false;
                            }
                            sFormat = "Invalid end of QuadraticBezier segment point type.";
                            line_number = 0xb2e;
                            goto LAB_0049175b;
                          }
                          if ((int)lVar8 == 0) {
                            bVar4 = ON_OutlineFigurePoint::IsOffFigure(&local_70);
                            if (!bVar4) {
                              if (!bLogErrors) {
                                return false;
                              }
                              sFormat = "Interior CubicBezierPoint point IsOffFigure() is false.";
                              line_number = 0xb36;
                              goto LAB_0049175b;
                            }
                          }
                          else {
                            bVar4 = ON_OutlineFigurePoint::IsOnFigure(&local_70);
                            if (!bVar4) {
                              if (!bLogErrors) {
                                return false;
                              }
                              sFormat = "End of QuadraticBezier point IsOnFigure() is false.";
                              line_number = 0xb3e;
                              goto LAB_0049175b;
                            }
                          }
                          lVar8 = lVar8 + 0xc;
                        } while ((int)lVar8 != 0x18);
                      }
                      else if (local_70.m_point_type == QuadraticBezierPoint) {
                        bVar4 = ON_OutlineFigurePoint::IsOffFigure(&local_70);
                        if (!bVar4) {
                          if (!bLogErrors) {
                            return false;
                          }
                          sFormat = "Interior QuadraticBezier point IsOffFigure() is false.";
                          line_number = 0xaf6;
                          goto LAB_0049175b;
                        }
                        uVar6 = (int)uVar7 + 1;
                        if (OVar5 <= uVar6) {
                          if (!bLogErrors) {
                            return false;
                          }
                          sFormat = "Invalid QuadraticBezier segment.";
                          line_number = 0xafc;
                          goto LAB_0049175b;
                        }
                        pOVar1 = pOVar2 + uVar6;
                        local_70.m_point_type = pOVar1->m_point_type;
                        local_70.m_point_proximity = pOVar1->m_point_proximity;
                        local_70.m_figure_index = pOVar1->m_figure_index;
                        local_70.m_point.x = (pOVar1->m_point).x;
                        local_70.m_point.y = pOVar2[uVar6].m_point.y;
                        if (OVar3 != local_70.m_figure_index) {
                          if (!bLogErrors) {
                            return false;
                          }
                          sFormat = 
                          "BeginFigure and interior point have different m_contour_index values.";
                          line_number = 0xb03;
                          goto LAB_0049175b;
                        }
                        local_60 = (ulong)uVar6;
                        if (local_70.m_point_type != QuadraticBezierPoint) {
                          if (!bLogErrors) {
                            return false;
                          }
                          sFormat = "Invalid end of QuadraticBezier segment point type.";
                          line_number = 0xb09;
                          goto LAB_0049175b;
                        }
                        bVar4 = ON_OutlineFigurePoint::IsOnFigure(&local_70);
                        if (!bVar4) {
                          if (!bLogErrors) {
                            return false;
                          }
                          sFormat = "End of QuadraticBezier point IsOnFigure() is false.";
                          line_number = 0xb0f;
                          goto LAB_0049175b;
                        }
                      }
                      else {
                        if (local_70.m_point_type != LineTo) {
                          if (!bLogErrors) {
                            return false;
                          }
                          sFormat = "Invalid point type for figure interior.";
                          line_number = 0xb46;
                          local_60 = uVar7;
                          goto LAB_0049175b;
                        }
                        local_60 = uVar7;
                        bVar4 = ON_OutlineFigurePoint::IsOnFigure(&local_70);
                        if (!bVar4) {
                          if (!bLogErrors) {
                            return false;
                          }
                          sFormat = "LineTo point IsOnFigure() is false.";
                          line_number = 0xaec;
                          goto LAB_0049175b;
                        }
                      }
                      uVar6 = (int)local_60 + 1;
                      uVar7 = (ulong)uVar6;
                      if (OVar5 <= uVar6) {
                        return true;
                      }
                    } while( true );
                  }
                  if (!bLogErrors) {
                    return false;
                  }
                  sFormat = "Open figure is not terminated with an EndFigureOpen point.";
                  line_number = 0xad5;
                }
                else if (local_48.m_point_type == EndFigureClosed) {
                  bVar4 = ON_2fPoint::operator==(&local_58.m_point,&local_48.m_point);
                  if (bVar4) goto LAB_004918c8;
                  if (!bLogErrors) {
                    return false;
                  }
                  sFormat = "Closed figure has different start and end points.";
                  line_number = 0xacd;
                }
                else {
                  if (!bLogErrors) {
                    return false;
                  }
                  sFormat = "Closed figure is not terminated with an EndFigureClosed point.";
                  line_number = 0xac8;
                }
              }
              else {
                if (!bLogErrors) {
                  return false;
                }
                sFormat = "EndFigure point IsOnFigure() is false.";
                line_number = 0xabf;
              }
            }
            else {
              if (!bLogErrors) {
                return false;
              }
              sFormat = "BeginFigure point IsOnFigure() is false.";
              line_number = 0xab9;
            }
          }
          else {
            if (!bLogErrors) {
              return false;
            }
            sFormat = "BeginFigure and EndFigure points have different m_contour_index values.";
            line_number = 0xab3;
          }
        }
      }
    }
    else {
      if (!bLogErrors) {
        return false;
      }
      sFormat = "m_points[0] is not a BeginFigure point.";
      line_number = 0xa9f;
    }
LAB_0049175b:
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_glyph_outline.cpp"
               ,line_number,"",sFormat);
  }
  return false;
}

Assistant:

bool ON_OutlineFigure::IsValidFigure(
  bool bLogErrors
) const
{
  const ON__UINT32 figure_end_dex = Internal_FigureEndDex(bLogErrors);
  if (0 == figure_end_dex)
  {
    return false;
  }

  const ON_OutlineFigurePoint* a = m_points.Array();


  const ON_OutlineFigurePoint figure_start = a[0];
  if (false == figure_start.IsBeginFigurePoint())
  {
    if ( bLogErrors ) ON_ERROR("m_points[0] is not a BeginFigure point.");
    return false;
  }
  if ( ON_OutlineFigurePoint::Type::BeginFigureUnknown == figure_start.m_point_type)
  {
    // Finished figures never have BeginFigureUnknown point type.
    if ( bLogErrors ) ON_ERROR("m_outline_points[figure_start_dex] is ON_OutlineFigurePoint::Type::BeginFigureUnknown.");
    return false;
  }

  const ON__UINT16 figure_id = figure_start.m_figure_index;
  if (0 == figure_id)
  {
    if ( bLogErrors ) ON_ERROR("BeginFigure point has 0 = m_contour_index.");
    return false;
  }

  const ON_OutlineFigurePoint figure_end = a[figure_end_dex];
  if (figure_id != figure_end.m_figure_index)
  {
    if ( bLogErrors ) ON_ERROR("BeginFigure and EndFigure points have different m_contour_index values.");
    return false;
  }

  if ( false == figure_start.IsOnFigure())
  {
    if ( bLogErrors ) ON_ERROR("BeginFigure point IsOnFigure() is false.");
    return false;
  }

  if (false == figure_end.IsOnFigure())
  {
    if ( bLogErrors ) ON_ERROR("EndFigure point IsOnFigure() is false.");
    return false;
  }

  const bool bClosedFigure = (ON_OutlineFigurePoint::Type::BeginFigureOpen != figure_start.m_point_type);
  if (bClosedFigure)
  {
    if (ON_OutlineFigurePoint::Type::EndFigureClosed != figure_end.m_point_type)
    {
      if ( bLogErrors ) ON_ERROR("Closed figure is not terminated with an EndFigureClosed point.");
      return false;
    }
    if (false == (figure_start.m_point == figure_end.m_point))
    {
      if ( bLogErrors ) ON_ERROR("Closed figure has different start and end points.");
      return false;
    }
  }
  else
  {
    if (ON_OutlineFigurePoint::Type::EndFigureOpen != figure_end.m_point_type)
    {
      if ( bLogErrors ) ON_ERROR("Open figure is not terminated with an EndFigureOpen point.");
      return false;
    }
  }

  // Validate EndFigure bToPoint setting.

  ON_OutlineFigurePoint p0, p1;
  p1 = figure_start;
  for (ON__UINT32 i = 1; i < figure_end_dex; i++)
  {
    p0 = p1;
    p1 = a[i];
    if (figure_id != p1.m_figure_index)
    {
      if (bLogErrors) ON_ERROR("BeginFigure and interior point have different m_contour_index values.");
      return false;
    }
    
    if (ON_OutlineFigurePoint::Type::LineTo == p1.m_point_type)
    {
      if (false == p1.IsOnFigure())
      {
        if (bLogErrors) ON_ERROR("LineTo point IsOnFigure() is false.");
        return false;
      }
      continue;
    }

    if (ON_OutlineFigurePoint::Type::QuadraticBezierPoint == p1.m_point_type)
    {
      if (false == p1.IsOffFigure())
      {
        if (bLogErrors) ON_ERROR("Interior QuadraticBezier point IsOffFigure() is false.");
        return false;
      }

      if (i + 1 >= figure_end_dex)
      {
        if (bLogErrors) ON_ERROR("Invalid QuadraticBezier segment.");
        return false;
      }

      p1 = a[++i];
      if (figure_id != p1.m_figure_index)
      {
        if (bLogErrors) ON_ERROR("BeginFigure and interior point have different m_contour_index values.");
        return false;
      }

      if (ON_OutlineFigurePoint::Type::QuadraticBezierPoint != p1.m_point_type)
      {
        if (bLogErrors) ON_ERROR("Invalid end of QuadraticBezier segment point type.");
        return false;
      }

      if (false == p1.IsOnFigure())
      {
        if (bLogErrors) ON_ERROR("End of QuadraticBezier point IsOnFigure() is false.");
        return false;
      }
      continue;
    }

    if (ON_OutlineFigurePoint::Type::CubicBezierPoint == p1.m_point_type)
    {
      if (false == p1.IsOffFigure())
      {
        if (bLogErrors) ON_ERROR("Interior CubicBezierPoint point IsOffFigure() is false.");
        return false;
      }

      for (int cv_dex = 2; cv_dex <= 3; cv_dex++)
      {
        if (i + 1 >= figure_end_dex)
        {
          if (bLogErrors) ON_ERROR("Invalid CubicBezierPoint segment.");
          return false;
        }

        p1 = a[++i];
        if (figure_id != p1.m_figure_index)
        {
          if (bLogErrors) ON_ERROR("BeginFigure and interior point have different m_contour_index values.");
          return false;
        }

        if (ON_OutlineFigurePoint::Type::CubicBezierPoint != p1.m_point_type)
        {
          if (bLogErrors) ON_ERROR("Invalid end of QuadraticBezier segment point type.");
          return false;
        }

        if (2 == cv_dex)
        {
          if (false == p1.IsOffFigure())
          {
            if (bLogErrors) ON_ERROR("Interior CubicBezierPoint point IsOffFigure() is false.");
            return false;
          }
        }
        else
        {
          if (false == p1.IsOnFigure())
          {
            if (bLogErrors) ON_ERROR("End of QuadraticBezier point IsOnFigure() is false.");
            return false;
          }
        }
      }
      continue;
    }

    if (bLogErrors) ON_ERROR("Invalid point type for figure interior.");
    return false;
  }

  return true;
}